

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sipc.c
# Opt level: O3

void nn_sipc_term(nn_sipc *self)

{
  if (self->state == 1) {
    nn_fsm_event_term(&self->done);
    nn_msg_term(&self->outmsg);
    nn_msg_term(&self->inmsg);
    nn_pipebase_term(&self->pipebase);
    nn_streamhdr_term(&self->streamhdr);
    nn_fsm_term(&self->fsm);
    return;
  }
  nn_sipc_term_cold_1();
}

Assistant:

void nn_sipc_term (struct nn_sipc *self)
{
    nn_assert_state (self, NN_SIPC_STATE_IDLE);

    nn_fsm_event_term (&self->done);
    nn_msg_term (&self->outmsg);
    nn_msg_term (&self->inmsg);
    nn_pipebase_term (&self->pipebase);
    nn_streamhdr_term (&self->streamhdr);
    nn_fsm_term (&self->fsm);
}